

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubkey.cpp
# Opt level: O0

bool __thiscall
CPubKey::RecoverCompact
          (CPubKey *this,uint256 *hash,vector<unsigned_char,_std::allocator<unsigned_char>_> *vchSig
          )

{
  long lVar1;
  uint uVar2;
  int iVar3;
  size_type sVar4;
  byte *pbVar5;
  const_reference pvVar6;
  uchar *in_RDI;
  long in_FS_OFFSET;
  bool fComp;
  int recid;
  size_t publen;
  uchar pub [65];
  secp256k1_ecdsa_recoverable_signature sig;
  secp256k1_pubkey pubkey;
  undefined7 in_stack_fffffffffffffed8;
  undefined1 in_stack_fffffffffffffedf;
  size_type in_stack_fffffffffffffee0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffee8;
  secp256k1_context *pend;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 uVar7;
  bool local_e1;
  undefined8 in_stack_ffffffffffffff20;
  uchar *in_stack_ffffffffffffff28;
  secp256k1_ecdsa_recoverable_signature *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  uint in_stack_ffffffffffffff3c;
  secp256k1_pubkey *in_stack_ffffffffffffff40;
  size_t *in_stack_ffffffffffffff48;
  uchar *in_stack_ffffffffffffff50;
  secp256k1_context *in_stack_ffffffffffffff58;
  uchar *in_stack_ffffffffffffff90;
  secp256k1_ecdsa_recoverable_signature *in_stack_ffffffffffffff98;
  secp256k1_pubkey *in_stack_ffffffffffffffa0;
  secp256k1_context *in_stack_ffffffffffffffa8;
  
  iVar3 = (int)((ulong)in_stack_ffffffffffffff20 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
  if (sVar4 == 0x41) {
    pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
    uVar2 = *pbVar5 - 0x1b & 3;
    pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
    uVar7 = CONCAT13((*pvVar6 - 0x1b & 4) != 0,(int3)in_stack_fffffffffffffef8);
    pend = secp256k1_context_static;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)secp256k1_context_static,
               in_stack_fffffffffffffee0);
    iVar3 = secp256k1_ecdsa_recoverable_signature_parse_compact
                      ((secp256k1_context *)
                       CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                       in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,iVar3);
    if (iVar3 == 0) {
      local_e1 = false;
    }
    else {
      base_blob<256U>::begin
                ((base_blob<256U> *)CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
      iVar3 = secp256k1_ecdsa_recover
                        (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                         in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
      if (iVar3 == 0) {
        local_e1 = false;
      }
      else {
        secp256k1_ec_pubkey_serialize
                  (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                   in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
        Set<unsigned_char*>((CPubKey *)CONCAT44(uVar2,uVar7),in_RDI,(uchar *)pend);
        local_e1 = true;
      }
    }
  }
  else {
    local_e1 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_e1;
  }
  __stack_chk_fail();
}

Assistant:

bool CPubKey::RecoverCompact(const uint256 &hash, const std::vector<unsigned char>& vchSig) {
    if (vchSig.size() != COMPACT_SIGNATURE_SIZE)
        return false;
    int recid = (vchSig[0] - 27) & 3;
    bool fComp = ((vchSig[0] - 27) & 4) != 0;
    secp256k1_pubkey pubkey;
    secp256k1_ecdsa_recoverable_signature sig;
    if (!secp256k1_ecdsa_recoverable_signature_parse_compact(secp256k1_context_static, &sig, &vchSig[1], recid)) {
        return false;
    }
    if (!secp256k1_ecdsa_recover(secp256k1_context_static, &pubkey, &sig, hash.begin())) {
        return false;
    }
    unsigned char pub[SIZE];
    size_t publen = SIZE;
    secp256k1_ec_pubkey_serialize(secp256k1_context_static, pub, &publen, &pubkey, fComp ? SECP256K1_EC_COMPRESSED : SECP256K1_EC_UNCOMPRESSED);
    Set(pub, pub + publen);
    return true;
}